

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void piweight(double *phi,double *theta,double *piw,int p,int q,int j)

{
  undefined8 *__ptr;
  double *ph;
  double temp;
  int local_30;
  int k;
  int i;
  int j_local;
  int q_local;
  int p_local;
  double *piw_local;
  double *theta_local;
  double *phi_local;
  
  *piw = 1.0;
  __ptr = (undefined8 *)malloc((long)(p + 1) << 3);
  *__ptr = 0xbff0000000000000;
  for (local_30 = 0; local_30 < p; local_30 = local_30 + 1) {
    __ptr[local_30 + 1] = phi[local_30];
  }
  for (local_30 = 1; local_30 < j; local_30 = local_30 + 1) {
    piw[local_30] = 0.0;
    ph = (double *)0x0;
    if (local_30 <= p) {
      piw[local_30] = -(double)__ptr[local_30];
    }
    for (temp._4_4_ = 1; temp._4_4_ < q + 1; temp._4_4_ = temp._4_4_ + 1) {
      if (-1 < local_30 - temp._4_4_) {
        ph = (double *)(theta[temp._4_4_ + -1] * piw[local_30 - temp._4_4_] + (double)ph);
      }
    }
    piw[local_30] = piw[local_30] - (double)ph;
  }
  free(__ptr);
  return;
}

Assistant:

void piweight(double *phi,double *theta,double *piw,int p,int q,int j) {
	int i,k;
	double temp;
	double *ph;
	piw[0] = 1.0;
	ph = (double*) malloc(sizeof(double) * (p+1));	
	ph[0] = -1.;
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 1; i < j;++i) {
		piw[i] = 0.0;
		temp = 0.0;
		if(i <= p) {
			piw[i] = -ph[i];
		}
		for(k = 1; k < q+1;++k) {
			if((i - k) >= 0) {
				temp+=theta[k-1] * piw[i-k];
			} 
			
		}
		piw[i] -= temp;
	}
	
	free(ph);
	
}